

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::FboColorTexCubeCase::render(FboColorTexCubeCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  deUint32 framebuffer;
  bool bVar1;
  int i_1;
  deUint32 dVar2;
  DataType DVar3;
  deUint32 program;
  int iVar4;
  int iVar5;
  Context *pCVar6;
  TransferFormat TVar7;
  pointer puVar8;
  pointer puVar9;
  long lVar10;
  ulong uVar11;
  int i;
  float fVar12;
  deUint32 tex;
  Vec4 retVal;
  deUint32 tmpTex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> fbos;
  vector<int,_std::allocator<int>_> order;
  TextureFormat texFmt;
  Vec3 p0;
  void *local_410;
  Vec4 local_408;
  Surface *local_3f8;
  long local_3f0;
  Vector<float,_4> res;
  Random rnd;
  TextureFormatInfo fmtInfo;
  TextureCubeShader cubeTexShader;
  Texture2DShader texToFboShader;
  
  dVar2 = deStringHash((this->super_FboColorbufferCase).super_FboTestCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar2 ^ 0x9eef603d);
  texFmt = glu::mapGLInternalFormat((this->super_FboColorbufferCase).m_format);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  cubeTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  cubeTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cubeTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  res.m_data[0] = 5.60519e-44;
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&cubeTexShader,(iterator)0x0,
             (DataType *)&res);
  DVar3 = FboTestUtil::getFragmentOutputType(&texFmt);
  res.m_data[0] = fmtInfo.valueMax.m_data[0] - fmtInfo.valueMin.m_data[0];
  res.m_data[1] = fmtInfo.valueMax.m_data[1] - fmtInfo.valueMin.m_data[1];
  res.m_data[2] = fmtInfo.valueMax.m_data[2] - fmtInfo.valueMin.m_data[2];
  res.m_data[3] = fmtInfo.valueMax.m_data[3] - fmtInfo.valueMin.m_data[3];
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texToFboShader,(DataTypes *)&cubeTexShader,DVar3,&res,&fmtInfo.valueMin);
  if (cubeTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader != (_func_int **)0x0)
  {
    operator_delete(cubeTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader,
                    (long)cubeTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)cubeTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader);
  }
  DVar3 = glu::getSamplerCubeType(texFmt);
  FboTestUtil::TextureCubeShader::TextureCubeShader(&cubeTexShader,DVar3,TYPE_FLOAT_VEC4);
  this_00 = &(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper;
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  dVar2 = (*pCVar6->_vptr_Context[0x75])(pCVar6,&texToFboShader);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar6->_vptr_Context[0x75])(pCVar6,&cubeTexShader);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::Texture2DShader::setUniforms(&texToFboShader,pCVar6,dVar2);
  FboTestUtil::TextureCubeShader::setTexScaleBias
            (&cubeTexShader,&fmtInfo.lookupScale,&fmtInfo.lookupBias);
  fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f8 = dst;
  TVar7 = glu::getTransferFormat(texFmt);
  bVar1 = glu::isGLInternalColorFormatFilterable((this->super_FboColorbufferCase).m_format);
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glTexParameteri(this_00,0x8513,0x2802,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0x8513,0x2803,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0x8513,0x2801,bVar1 | 0x2600);
  sglr::ContextWrapper::glTexParameteri(this_00,0x8513,0x2800,bVar1 | 0x2600);
  lVar10 = 0;
  do {
    sglr::ContextWrapper::glTexImage2D
              (this_00,*(deUint32 *)((long)render::cubeGLFaces + lVar10),0,
               (this->super_FboColorbufferCase).m_format,
               *(int *)&(this->super_FboColorbufferCase).field_0x8c,*(int *)&this->field_0x90,0,
               TVar7.format,TVar7.dataType,(void *)0x0);
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x18);
  FboTestCase::checkError((FboTestCase *)this);
  lVar10 = 0;
  do {
    sglr::ContextWrapper::glGenFramebuffers(this_00,1,(deUint32 *)&res);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,(deUint32)res.m_data[0]);
    sglr::ContextWrapper::glFramebufferTexture2D
              (this_00,0x8d40,0x8ce0,*(deUint32 *)((long)render::cubeGLFaces + lVar10),tex,0);
    FboTestCase::checkError((FboTestCase *)this);
    FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
    if (fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&fbos,
                 (iterator)
                 fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&res);
    }
    else {
      *fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = (uint)res.m_data[0];
      fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x18);
  order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar11 = 0;
    puVar8 = fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar9 = fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      res.m_data[0] = (float)uVar11;
      if (order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&order,(iterator)
                          order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish,(int *)&res);
        puVar8 = fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar9 = fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        *order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = (int)res.m_data[0];
        order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)((long)puVar9 - (long)puVar8 >> 2));
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&rnd,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                  order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  uVar11 = 0;
  do {
    local_3f0 = (long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar11];
    tmpTex = 0;
    framebuffer = fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_3f0];
    p0.m_data._0_8_ = glu::mapGLTransferFormat(0x1908,0x1401);
    tcu::TextureLevel::TextureLevel((TextureLevel *)&res,(TextureFormat *)&p0,0x80,0x80,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&p0,(TextureLevel *)&res);
    retVal.m_data[2] = 0.0;
    retVal.m_data[0] = 0.0;
    retVal.m_data[1] = 0.0;
    lVar10 = 0;
    do {
      fVar12 = deRandom_getFloat(&rnd.m_rnd);
      retVal.m_data[lVar10] = fVar12;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    retVal.m_data[3] = 1.0;
    local_408.m_data[0] = 0.0;
    local_408.m_data[1] = 0.0;
    local_408.m_data[2] = 0.0;
    local_408.m_data[3] = 0.0;
    tcu::fillWithGrid((PixelBufferAccess *)&p0,8,&retVal,&local_408);
    sglr::ContextWrapper::glGenTextures(this_00,1,&tmpTex);
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,tmpTex);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2601);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&p0,(TextureLevel *)&res);
    sglr::ContextWrapper::glTexImage2D(this_00,0xde1,0,0x1908,0x80,0x80,0,0x1908,0x1401,local_410);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,framebuffer);
    sglr::ContextWrapper::glViewport
              (this_00,0,0,*(int *)&(this->super_FboColorbufferCase).field_0x8c,
               *(int *)&this->field_0x90);
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
    p0.m_data[0] = -1.0;
    p0.m_data[1] = -1.0;
    p0.m_data[2] = 0.0;
    retVal.m_data[0] = 1.0;
    retVal.m_data[1] = 1.0;
    retVal.m_data[2] = 0.0;
    sglr::drawQuad(pCVar6,dVar2,&p0,(Vec3 *)&retVal);
    FboTestCase::checkError((FboTestCase *)this);
    p0.m_data[1] = (float)((uint)(uVar11 >> 1) & 0x7fffffff) + -1.0;
    p0.m_data[0] = (float)(int)(((uint)uVar11 & 1) - 1);
    p0.m_data[2] = 0.0;
    local_408.m_data[0] = 1.0;
    local_408.m_data[1] = 1.0;
    local_408.m_data._8_8_ = local_408.m_data._8_8_ & 0xffffffff00000000;
    retVal.m_data[2] = 0.0;
    retVal.m_data[0] = 0.0;
    retVal.m_data[1] = 0.0;
    lVar10 = 0;
    do {
      retVal.m_data[lVar10] = p0.m_data[lVar10] + local_408.m_data[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,0);
    iVar4 = sglr::ContextWrapper::getWidth(this_00);
    iVar5 = sglr::ContextWrapper::getHeight(this_00);
    sglr::ContextWrapper::glViewport(this_00,0,0,iVar4,iVar5);
    sglr::ContextWrapper::glActiveTexture(this_00,0x84c0);
    sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
    FboTestUtil::TextureCubeShader::setFace(&cubeTexShader,render::cubeTexFaces[local_3f0]);
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
    FboTestUtil::TextureCubeShader::setUniforms(&cubeTexShader,pCVar6,program);
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
    sglr::drawQuad(pCVar6,program,&p0,(Vec3 *)&retVal);
    FboTestCase::checkError((FboTestCase *)this);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&res);
    uVar11 = uVar11 + 1;
  } while (uVar11 != 4);
  iVar4 = sglr::ContextWrapper::getWidth(this_00);
  iVar5 = sglr::ContextWrapper::getHeight(this_00);
  FboTestCase::readPixels((FboTestCase *)this,local_3f8,0,0,iVar4,iVar5);
  if (order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  sglr::ShaderProgram::~ShaderProgram(&cubeTexShader.super_ShaderProgram);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texToFboShader);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		static const deUint32 cubeGLFaces[] =
		{
			GL_TEXTURE_CUBE_MAP_POSITIVE_X,
			GL_TEXTURE_CUBE_MAP_POSITIVE_Y,
			GL_TEXTURE_CUBE_MAP_POSITIVE_Z,
			GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
			GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
			GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
		};

		static const tcu::CubeFace cubeTexFaces[] =
		{
			tcu::CUBEFACE_POSITIVE_X,
			tcu::CUBEFACE_POSITIVE_Y,
			tcu::CUBEFACE_POSITIVE_Z,
			tcu::CUBEFACE_NEGATIVE_X,
			tcu::CUBEFACE_NEGATIVE_Y,
			tcu::CUBEFACE_NEGATIVE_Z
		};

		de::Random				rnd					(deStringHash(getName()) ^ 0x9eef603d);
		tcu::TextureFormat		texFmt				= glu::mapGLInternalFormat(m_format);
		tcu::TextureFormatInfo	fmtInfo				= tcu::getTextureFormatInfo(texFmt);

		Texture2DShader			texToFboShader		(DataTypes() << glu::TYPE_SAMPLER_2D, getFragmentOutputType(texFmt), fmtInfo.valueMax-fmtInfo.valueMin, fmtInfo.valueMin);
		TextureCubeShader		cubeTexShader		(glu::getSamplerCubeType(texFmt), glu::TYPE_FLOAT_VEC4);

		deUint32				texToFboShaderID	= getCurrentContext()->createProgram(&texToFboShader);
		deUint32				cubeTexShaderID		= getCurrentContext()->createProgram(&cubeTexShader);

		// Setup shaders
		texToFboShader.setUniforms(*getCurrentContext(), texToFboShaderID);
		cubeTexShader.setTexScaleBias(fmtInfo.lookupScale, fmtInfo.lookupBias);

		// Framebuffers.
		std::vector<deUint32>	fbos;
		deUint32				tex;

		{
			glu::TransferFormat		transferFmt		= glu::getTransferFormat(texFmt);
			bool					isFilterable	= glu::isGLInternalColorFormatFilterable(m_format);
			const IVec2&			size			= m_texSize;


			glGenTextures(1, &tex);

			glBindTexture(GL_TEXTURE_CUBE_MAP,		tex);
			glTexParameteri(GL_TEXTURE_CUBE_MAP,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_CUBE_MAP,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_CUBE_MAP,	GL_TEXTURE_MIN_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexParameteri(GL_TEXTURE_CUBE_MAP,	GL_TEXTURE_MAG_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);

			// Generate an image and FBO for each cube face
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cubeGLFaces); ndx++)
				glTexImage2D(cubeGLFaces[ndx], 0, m_format, size.x(), size.y(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);
			checkError();

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cubeGLFaces); ndx++)
			{
				deUint32			layerFbo;

				glGenFramebuffers(1, &layerFbo);
				glBindFramebuffer(GL_FRAMEBUFFER, layerFbo);
				glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, cubeGLFaces[ndx], tex, 0);
				checkError();
				checkFramebufferStatus(GL_FRAMEBUFFER);

				fbos.push_back(layerFbo);
			}
		}

		// Render test images to random cube faces
		std::vector<int> order;

		for (size_t n = 0; n < fbos.size(); n++)
			order.push_back((int)n);
		rnd.shuffle(order.begin(), order.end());

		DE_ASSERT(order.size() >= 4);
		for (int ndx = 0; ndx < 4; ndx++)
		{
			const int			face		= order[ndx];
			const deUint32		format		= GL_RGBA;
			const deUint32		dataType	= GL_UNSIGNED_BYTE;
			const int			texW		= 128;
			const int			texH		= 128;
			deUint32			tmpTex		= 0;
			const deUint32		fbo			= fbos[face];
			const IVec2&		viewport	= m_texSize;
			tcu::TextureLevel	data		(glu::mapGLTransferFormat(format, dataType), texW, texH, 1);

			tcu::fillWithGrid(data.getAccess(), 8, generateRandomColor(rnd), Vec4(0.0f));

			glGenTextures(1, &tmpTex);
			glBindTexture(GL_TEXTURE_2D, tmpTex);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, format, texW, texH, 0, format, dataType, data.getAccess().getDataPtr());

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glViewport(0, 0, viewport.x(), viewport.y());
			sglr::drawQuad(*getCurrentContext(), texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
			checkError();

			// Render to framebuffer
			{
				const Vec3		p0	= Vec3(float(ndx % 2) - 1.0f, float(ndx / 2) - 1.0f, 0.0f);
				const Vec3		p1	= p0 + Vec3(1.0f, 1.0f, 0.0f);

				glBindFramebuffer(GL_FRAMEBUFFER, 0);
				glViewport(0, 0, getWidth(), getHeight());

				glActiveTexture(GL_TEXTURE0);
				glBindTexture(GL_TEXTURE_CUBE_MAP, tex);

				cubeTexShader.setFace(cubeTexFaces[face]);
				cubeTexShader.setUniforms(*getCurrentContext(), cubeTexShaderID);

				sglr::drawQuad(*getCurrentContext(), cubeTexShaderID, p0, p1);
				checkError();
			}
		}

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}